

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O0

_Bool menu_handle_keypress(menu_conflict *menu,ui_event *in,ui_event *out)

{
  _Bool _Var1;
  int cursor;
  wchar_t wVar2;
  ui_event uVar3;
  undefined1 extraout_DL;
  keypress ch;
  keypress key;
  int local_7c;
  undefined4 local_70;
  int dir;
  int total;
  int rows;
  int new_cursor;
  int count;
  _Bool eat;
  ui_event *out_local;
  ui_event *in_local;
  menu_conflict *menu_local;
  
  new_cursor._3_1_ = false;
  if (menu->filter_list == (int *)0x0) {
    local_7c = menu->count;
  }
  else {
    local_7c = menu->filter_count;
  }
  key._9_3_ = 0;
  key._0_9_ = *(unkuint9 *)in;
  cursor = get_cursor_key(menu,menu->top,key);
  if ((cursor < 0) || (_Var1 = is_valid_row(menu,cursor), !_Var1)) {
    if ((in->key).code == 0xe000) {
      out->type = EVT_ESCAPE;
    }
    else if (local_7c < 1) {
      new_cursor._3_1_ = true;
    }
    else if ((in->key).code == 0x20) {
      if ((menu->active).page_rows < local_7c) {
        menu->cursor = (menu->active).page_rows + menu->cursor;
        if (local_7c + -1 <= menu->cursor) {
          menu->cursor = 0;
        }
        menu->top = menu->cursor;
        out->type = EVT_MOVE;
      }
      else {
        new_cursor._3_1_ = true;
      }
    }
    else if ((in->key).code == 0x9c) {
      out->type = EVT_SELECT;
    }
    else {
      ch._9_3_ = 0;
      ch._0_9_ = *(unkuint9 *)in;
      wVar2 = target_dir(ch);
      if ((wVar2 != L'\0') && (_Var1 = no_valid_row(menu,local_7c), !_Var1)) {
        uVar3._0_8_ = (*menu->skin->process_dir)(menu,wVar2);
        local_70 = CONCAT31(local_70._1_3_,extraout_DL);
        out->mouse = uVar3.mouse;
        *(undefined4 *)&(out->key).mods = local_70;
        if (out->type == EVT_MOVE) {
          while (_Var1 = is_valid_row(menu,menu->cursor), ((_Var1 ^ 0xffU) & 1) != 0) {
            if (local_7c + -1 < menu->cursor) {
              menu->cursor = 0;
            }
            else if (menu->cursor < 0) {
              menu->cursor = local_7c + -1;
            }
            else {
              menu->cursor = (int)ddy[wVar2] + menu->cursor;
            }
          }
          if (menu->cursor < 0) {
            __assert_fail("menu->cursor >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                          ,0x2ec,
                          "_Bool menu_handle_keypress(struct menu *, const ui_event *, ui_event *)")
            ;
          }
          if (local_7c <= menu->cursor) {
            __assert_fail("menu->cursor < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-menu.c"
                          ,0x2ed,
                          "_Bool menu_handle_keypress(struct menu *, const ui_event *, ui_event *)")
            ;
          }
        }
      }
    }
  }
  else {
    if (((menu->flags & 0x10U) == 0) || (cursor == menu->cursor)) {
      out->type = EVT_SELECT;
    }
    else {
      out->type = EVT_MOVE;
    }
    menu->cursor = cursor;
  }
  return new_cursor._3_1_;
}

Assistant:

bool menu_handle_keypress(struct menu *menu, const ui_event *in,
		ui_event *out)
{
	bool eat = false;
	int count = menu->filter_list ? menu->filter_count : menu->count;

	/* Get the new cursor position from the menu item tags */
	int new_cursor = get_cursor_key(menu, menu->top, in->key);
	if (new_cursor >= 0 && is_valid_row(menu, new_cursor)) {
		if (!(menu->flags & MN_DBL_TAP) || new_cursor == menu->cursor)
			out->type = EVT_SELECT;
		else
			out->type = EVT_MOVE;

		menu->cursor = new_cursor;
	} else if (in->key.code == ESCAPE) {
		/* Escape stops us here */
		out->type = EVT_ESCAPE;
	} else if (count <= 0) {
		/* Menus with no rows can't be navigated or used, so eat keypresses */
		eat = true;
	} else if (in->key.code == ' ') {
		/* Try existing, known keys */
		int rows = menu->active.page_rows;
		int total = count;

		if (rows < total) {
			/* Go to start of next page */
			menu->cursor += menu->active.page_rows;
			if (menu->cursor >= total - 1) menu->cursor = 0;
			menu->top = menu->cursor;
	
			out->type = EVT_MOVE;
		} else {
			eat = true;
		}
	} else if (in->key.code == KC_ENTER) {
		out->type = EVT_SELECT;
	} else {
		/* Try directional movement */
		int dir = target_dir(in->key);

		if (dir && !no_valid_row(menu, count)) {
			*out = menu->skin->process_dir(menu, dir);

			if (out->type == EVT_MOVE) {
				while (!is_valid_row(menu, menu->cursor)) {
					/* Loop around */
					if (menu->cursor > count - 1)
						menu->cursor = 0;
					else if (menu->cursor < 0)
						menu->cursor = count - 1;
					else
						menu->cursor += ddy[dir];
				}
			
				assert(menu->cursor >= 0);
				assert(menu->cursor < count);
			}
		}
	}

	return eat;
}